

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Nf_Man_t *p;
  Nf_Obj_t *pNVar4;
  void **ppvVar5;
  int *piVar6;
  float *pfVar7;
  word *pwVar8;
  Vec_Int_t *pVVar9;
  Vec_Mem_t *p_00;
  Vec_Wec_t *p_01;
  abctime aVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  timespec ts;
  timespec local_38;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x174,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (4 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x175,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  pVVar9 = pGia->vCellMapping;
  if (pVVar9 != (Vec_Int_t *)0x0) {
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      pGia->vCellMapping->pArray = (int *)0x0;
      pVVar9 = pGia->vCellMapping;
      if (pVVar9 == (Vec_Int_t *)0x0) goto LAB_006f8bb9;
    }
    free(pVVar9);
    pGia->vCellMapping = (Vec_Int_t *)0x0;
  }
LAB_006f8bb9:
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  p = (Nf_Man_t *)calloc(1,0x118);
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    aVar10 = -1;
  }
  else {
    aVar10 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->clkStart = aVar10;
  p->pGia = pGia;
  p->pPars = pPars;
  iVar2 = pGia->nObjs;
  pNVar4 = (Nf_Obj_t *)calloc((long)iVar2,0x60);
  p->pNfObjs = pNVar4;
  p->iCur = 2;
  if ((p->vPages).nCap < 0x100) {
    ppvVar5 = (p->vPages).pArray;
    if (ppvVar5 == (void **)0x0) {
      ppvVar5 = (void **)malloc(0x800);
    }
    else {
      ppvVar5 = (void **)realloc(ppvVar5,0x800);
      iVar2 = pGia->nObjs;
    }
    (p->vPages).pArray = ppvVar5;
    (p->vPages).nCap = 0x100;
  }
  uVar12 = iVar2 * 2;
  iVar15 = (p->vMapRefs).nCap;
  if (SBORROW4(iVar15,uVar12) != iVar15 + iVar2 * -2 < 0) {
    piVar6 = (p->vMapRefs).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar12 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar12 << 2);
    }
    (p->vMapRefs).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_006f9159;
    (p->vMapRefs).nCap = uVar12;
  }
  if (0 < iVar2) {
    memset((p->vMapRefs).pArray,0,(ulong)uVar12 << 2);
  }
  (p->vMapRefs).nSize = uVar12;
  iVar2 = pGia->nObjs;
  uVar1 = (long)iVar2 * 2;
  iVar15 = (int)uVar1;
  if ((p->vFlowRefs).nCap < iVar15) {
    pfVar7 = (p->vFlowRefs).pArray;
    sVar13 = (long)iVar2 << 3;
    if (pfVar7 == (float *)0x0) {
      pfVar7 = (float *)malloc(sVar13);
    }
    else {
      pfVar7 = (float *)realloc(pfVar7,sVar13);
    }
    (p->vFlowRefs).pArray = pfVar7;
    (p->vFlowRefs).nCap = iVar15;
  }
  if (0 < iVar2) {
    memset((p->vFlowRefs).pArray,0,(uVar1 & 0xffffffff) << 2);
  }
  (p->vFlowRefs).nSize = iVar15;
  iVar2 = pGia->nObjs;
  uVar1 = (long)iVar2 * 2;
  iVar15 = (int)uVar1;
  if ((p->vRequired).nCap < iVar15) {
    pwVar8 = (p->vRequired).pArray;
    sVar13 = (long)iVar2 << 4;
    if (pwVar8 == (word *)0x0) {
      pwVar8 = (word *)malloc(sVar13);
    }
    else {
      pwVar8 = (word *)realloc(pwVar8,sVar13);
    }
    (p->vRequired).pArray = pwVar8;
    if (pwVar8 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (p->vRequired).nCap = iVar15;
  }
  if (0 < iVar2) {
    memset((p->vRequired).pArray,0xff,(uVar1 & 0xffffffff) << 3);
  }
  (p->vRequired).nSize = iVar15;
  uVar12 = pGia->nObjs;
  if ((p->vCutSets).nCap < (int)uVar12) {
    piVar6 = (p->vCutSets).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar12 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar12 << 2);
    }
    (p->vCutSets).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_006f9159;
    (p->vCutSets).nCap = uVar12;
  }
  if (0 < (int)uVar12) {
    memset((p->vCutSets).pArray,0,(ulong)uVar12 * 4);
  }
  (p->vCutSets).nSize = uVar12;
  uVar12 = pGia->nObjs;
  if ((p->vCutFlows).nCap < (int)uVar12) {
    pfVar7 = (p->vCutFlows).pArray;
    if (pfVar7 == (float *)0x0) {
      pfVar7 = (float *)malloc((long)(int)uVar12 << 2);
    }
    else {
      pfVar7 = (float *)realloc(pfVar7,(long)(int)uVar12 << 2);
    }
    (p->vCutFlows).pArray = pfVar7;
    (p->vCutFlows).nCap = uVar12;
  }
  if (0 < (int)uVar12) {
    memset((p->vCutFlows).pArray,0,(ulong)uVar12 * 4);
  }
  (p->vCutFlows).nSize = uVar12;
  uVar12 = pGia->nObjs;
  if ((p->vCutDelays).nCap < (int)uVar12) {
    piVar6 = (p->vCutDelays).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar12 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar12 << 2);
    }
    (p->vCutDelays).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_006f9159;
    (p->vCutDelays).nCap = uVar12;
  }
  if (0 < (int)uVar12) {
    memset((p->vCutDelays).pArray,0,(ulong)uVar12 * 4);
  }
  (p->vCutDelays).nSize = uVar12;
  if ((p->vBackup).nCap < 1000) {
    piVar6 = (p->vBackup).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(4000);
    }
    else {
      piVar6 = (int *)realloc(piVar6,4000);
    }
    (p->vBackup).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_006f9159:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vBackup).nCap = 1000;
  }
  pVVar9 = (Vec_Int_t *)calloc(1,0x10);
  Mf_ManSetFlowRefs(pGia,pVVar9);
  iVar2 = pVVar9->nSize;
  piVar6 = pVVar9->pArray;
  if ((long)iVar2 < 1) {
    if (piVar6 == (int *)0x0) goto LAB_006f8f69;
  }
  else {
    uVar12 = (p->vFlowRefs).nSize;
    lVar14 = 0;
    do {
      if ((int)uVar12 <= lVar14) {
LAB_006f913a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      fVar16 = (float)*(int *)((long)piVar6 + lVar14 * 2);
      pfVar7 = (p->vFlowRefs).pArray;
      pfVar7[lVar14] = fVar16;
      if ((ulong)uVar12 <= lVar14 + 1U) goto LAB_006f913a;
      pfVar7[lVar14 + 1] = fVar16;
      lVar14 = lVar14 + 2;
    } while ((long)iVar2 * 2 != lVar14);
  }
  free(piVar6);
LAB_006f8f69:
  free(pVVar9);
  pwVar8 = (word *)malloc(8);
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = 1;
  p_00->LogPageSze = 0xc;
  p_00->PageMask = 0xfff;
  p_00->iPage = -1;
  uVar12 = 9999;
  while( true ) {
    do {
      uVar11 = uVar12;
      uVar12 = uVar11 + 1;
    } while ((uVar11 & 1) != 0);
    if (uVar12 < 9) break;
    iVar2 = 5;
    while (uVar12 % (iVar2 - 2U) != 0) {
      uVar3 = iVar2 * iVar2;
      iVar2 = iVar2 + 2;
      if (uVar12 < uVar3) goto LAB_006f8fe2;
    }
  }
LAB_006f8fe2:
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar11) {
    uVar3 = uVar12;
  }
  pVVar9->nCap = uVar3;
  piVar6 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar9->pArray = piVar6;
  pVVar9->nSize = uVar12;
  memset(piVar6,0xff,(long)(int)uVar12 << 2);
  p_00->vTable = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 10000;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(40000);
  pVVar9->pArray = piVar6;
  p_00->vNexts = pVVar9;
  *pwVar8 = 0;
  iVar2 = Vec_MemHashInsert(p_00,pwVar8);
  if (iVar2 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  *pwVar8 = 0xaaaaaaaaaaaaaaaa;
  iVar2 = Vec_MemHashInsert(p_00,pwVar8);
  if (iVar2 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  free(pwVar8);
  p->vTtMem = p_00;
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  pVVar9 = (Vec_Int_t *)calloc(1000,0x10);
  p_01->pArray = pVVar9;
  p->vTt2Match = p_01;
  Vec_WecPushLevel(p_01);
  Vec_WecPushLevel(p->vTt2Match);
  if (p->vTt2Match->nSize != p->vTtMem->nEntries) {
    __assert_fail("Vec_WecSize(p->vTt2Match) == Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x198,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  Nf_StoDeriveMatches(p,0);
  p->InvDelay = p->pCells[3].Delays[0];
  p->InvArea = p->pCells[3].Area;
  *(uint *)p->pNfObjs->M[0] = *(uint *)p->pNfObjs->M[0] & 0xfff00000;
  *(uint *)p->pNfObjs->M[1] = (*(uint *)p->pNfObjs->M[1] & 0xfff00000) + 1;
  return p;
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_WrdFill( &p->vRequired, 2*Gia_ManObjNum(pGia), NF_INFINITY );  // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    p->vTtMem    = Vec_MemAllocForTT( 6, 0 );          
    p->vTt2Match = Vec_WecAlloc( 1000 ); 
    Vec_WecPushLevel( p->vTt2Match );
    Vec_WecPushLevel( p->vTt2Match );
    assert( Vec_WecSize(p->vTt2Match) == Vec_MemEntryNum(p->vTtMem) );
    Nf_StoDeriveMatches( p, 0 );//pPars->fVerbose );
    p->InvDelay = p->pCells[3].Delays[0];
    p->InvArea  = p->pCells[3].Area;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}